

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkAddFanin(Sfm_Ntk_t *p,int iNode,int iFanin)

{
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar1;
  long lVar2;
  long lVar3;
  
  if (iFanin < 0) {
    return;
  }
  if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x115,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
  }
  if (p->nObjs <= p->nPos + iFanin) {
    __assert_fail("!Sfm_ObjIsPo(p, iFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x116,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
  }
  if ((-1 < iNode) && (iNode < (p->vFanins).nSize)) {
    pVVar1 = (p->vFanins).pArray;
    p_00 = pVVar1 + (uint)iNode;
    lVar2 = (long)pVVar1[(uint)iNode].nSize;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if (p_00->pArray[lVar3] == iFanin) {
          __assert_fail("Vec_IntFind( Sfm_ObjFiArray(p, iNode), iFanin ) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                        ,0x117,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if (iFanin < (p->vFanouts).nSize) {
      pVVar1 = (p->vFanouts).pArray;
      lVar2 = (long)pVVar1[(uint)iFanin].nSize;
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          if (pVVar1[(uint)iFanin].pArray[lVar3] == iNode) {
            __assert_fail("Vec_IntFind( Sfm_ObjFoArray(p, iFanin), iNode ) == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                          ,0x118,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
          }
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      Vec_IntPush(p_00,iFanin);
      if (iFanin < (p->vFanouts).nSize) {
        Vec_IntPush((p->vFanouts).pArray + (uint)iFanin,iNode);
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sfm_NtkAddFanin( Sfm_Ntk_t * p, int iNode, int iFanin )
{
    if ( iFanin < 0 )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( !Sfm_ObjIsPo(p, iFanin) );
    assert( Vec_IntFind( Sfm_ObjFiArray(p, iNode), iFanin ) == -1 );
    assert( Vec_IntFind( Sfm_ObjFoArray(p, iFanin), iNode ) == -1 );
    Vec_IntPush( Sfm_ObjFiArray(p, iNode), iFanin );
    Vec_IntPush( Sfm_ObjFoArray(p, iFanin), iNode );
}